

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

int Gia_SplitCofVar2(Gia_Man_t *p,int *pnFanouts,int *pnCost)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  bool bVar2;
  int local_34;
  int local_30;
  int CostBest;
  int iBest;
  int i;
  Gia_Obj_t *pObj;
  int *pnCost_local;
  int *pnFanouts_local;
  Gia_Man_t *p_local;
  
  local_30 = -1;
  local_34 = -1;
  if (p->pRefs == (int *)0x0) {
    Gia_ManCreateRefs(p);
  }
  CostBest = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar2 = false;
    if (CostBest < iVar1) {
      _iBest = Gia_ManCi(p,CostBest);
      bVar2 = _iBest != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjRefNum(p,_iBest);
    if (local_34 < iVar1) {
      local_30 = CostBest;
      local_34 = Gia_ObjRefNum(p,_iBest);
    }
    CostBest = CostBest + 1;
  }
  if (-1 < local_30) {
    pObj_00 = Gia_ManPi(p,local_30);
    iVar1 = Gia_ObjRefNum(p,pObj_00);
    *pnFanouts = iVar1;
    *pnCost = -1;
    return local_30;
  }
  __assert_fail("iBest >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                ,0xdd,"int Gia_SplitCofVar2(Gia_Man_t *, int *, int *)");
}

Assistant:

int Gia_SplitCofVar2( Gia_Man_t * p, int * pnFanouts, int * pnCost )
{
    Gia_Obj_t * pObj;
    int i, iBest = -1, CostBest = -1;
    if ( p->pRefs == NULL )
        Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
        if ( CostBest < Gia_ObjRefNum(p, pObj) )
            iBest = i, CostBest = Gia_ObjRefNum(p, pObj);
    assert( iBest >= 0 );
    *pnFanouts = Gia_ObjRefNum(p, Gia_ManPi(p, iBest));
    *pnCost = -1;
    return iBest;
}